

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O2

size_t __thiscall
ContextSpecificHolder<Extensions,_(unsigned_char)'\xa0',_(OptionType)1>::EncodedSize
          (ContextSpecificHolder<Extensions,_(unsigned_char)__xa0_,_(OptionType)1> *this)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = DerBase::EncodedSize((DerBase *)this);
  if (sVar1 < 3) {
    sVar1 = 0;
  }
  else {
    sVar2 = GetSizeBytes(sVar1);
    sVar1 = sVar2 + sVar1 + 1;
  }
  return sVar1;
}

Assistant:

size_t EncodedSize()
	{
		size_t innerSize = innerType.EncodedSize();

        // if innerType decodes to null, then this isn't present
        // Mirror the logic in Encode
        if (innerSize <= 2)
            return 0;

		return 1 + GetSizeBytes(innerSize) + innerSize;
	}